

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendBuffer.h
# Opt level: O2

void __thiscall SendBuffer::on_read_bytes(SendBuffer *this,int bt)

{
  Error *this_00;
  int iVar1;
  
  iVar1 = bt + this->read;
  this->read = iVar1;
  if (iVar1 <= this->full) {
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Read more bytes than was full");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void on_read_bytes(int bt) {
    read += bt;
    if (read > full) {
      throw Error("Read more bytes than was full");
    }
  }